

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  char **ppcVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ATTRIBUTE *pAVar9;
  char **ppcVar10;
  byte *pbVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar12;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  byte *pbVar13;
  char **ppcStack_50;
  int tok;
  uint uVar8;
  
  pAVar9 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar9 < 1) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  ppcVar3 = (char **)0x1;
  ppcStack_50 = ppcVar3;
  if (cVar1 == '\x05') {
    if (pAVar9 == (ATTRIBUTE *)0x1) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_01,&pAVar9->name), iVar4 == 0))
    goto LAB_00551652;
    ppcStack_50 = (char **)0x2;
  }
  else {
    if (cVar1 == '\x06') {
      if (pAVar9 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar5 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar5 != 0) goto LAB_00551652;
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_00,&pAVar9->name);
      ppcStack_50 = (char **)0x3;
    }
    else {
      if (cVar1 != '\a') {
        if ((cVar1 == '\x16') || (cVar1 == '\x18')) goto LAB_005516eb;
        goto LAB_00551652;
      }
      if (pAVar9 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,ptr,-2,pAVar9);
      if (iVar4 != 0) goto LAB_00551652;
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX,(char *)pAVar9);
      ppcStack_50 = (char **)0x4;
    }
    if (iVar4 == 0) {
LAB_00551652:
      *nextTokPtr = ptr;
      return 0;
    }
  }
LAB_005516eb:
  pbVar13 = (byte *)((long)ppcStack_50 + (long)ptr);
  do {
    uVar6 = (long)end - (long)pbVar13;
    if ((long)uVar6 < 1) {
      return -1;
    }
    uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    uVar7 = uVar8 - 5;
    if (0x18 < uVar7) {
switchD_0055172c_caseD_8:
      pbVar11 = pbVar13;
LAB_005518cf:
      *nextTokPtr = (char *)pbVar11;
      return 0;
    }
    ppcStack_50 = ppcVar3;
    switch(uVar8) {
    case 5:
      if (uVar6 == 1) {
        return -2;
      }
      ppcVar10 = ppcVar3;
      iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar13);
      if (iVar4 != 0) goto switchD_0055172c_caseD_1d;
      iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar13,extraout_RDX_02,ppcVar10);
      ppcStack_50 = (char **)0x2;
      break;
    case 6:
      if (uVar6 < 3) {
        return -2;
      }
      ppcVar10 = ppcVar3;
      pcVar5 = (*enc[3].skipS)(enc,(char *)pbVar13);
      if ((int)pcVar5 != 0) goto switchD_0055172c_caseD_1d;
      iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,extraout_RDX_04,ppcVar10);
      ppcStack_50 = (char **)0x3;
      break;
    case 7:
      if (uVar6 < 4) {
        return -2;
      }
      ppcVar10 = ppcVar3;
      iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar13,
                                (&switchD_0055172c::switchdataD_00732f9c)[uVar7] + 0x732f9c,
                                (ATTRIBUTE *)0x1);
      if (iVar4 != 0) goto switchD_0055172c_caseD_1d;
      iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,extraout_RDX_03,ppcVar10);
      ppcStack_50 = (char **)0x4;
      break;
    default:
      goto switchD_0055172c_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar4 = normal_checkPiTarget((ENCODING *)ptr,(char *)pbVar13,(char *)&tok,(int *)0x1);
      if (iVar4 == 0) goto switchD_0055172c_caseD_1d;
      uVar12 = extraout_RDX_05;
      pbVar13 = pbVar13 + 1;
      goto LAB_005517f5;
    case 0xf:
      iVar4 = normal_checkPiTarget((ENCODING *)ptr,(char *)pbVar13,(char *)&tok,(int *)0x1);
      if (iVar4 == 0) goto switchD_0055172c_caseD_1d;
      pbVar11 = pbVar13 + 1;
      if ((byte *)end == pbVar11 || (long)end - (long)pbVar11 < 0) {
        return -1;
      }
      if (*pbVar11 == 0x3e) {
        *nextTokPtr = (char *)(pbVar13 + 2);
        return tok;
      }
      goto LAB_005518cf;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0055172c_caseD_16;
    case 0x1d:
      goto switchD_0055172c_caseD_1d;
    }
    if (iVar4 == 0) {
switchD_0055172c_caseD_1d:
      *nextTokPtr = (char *)pbVar13;
      return 0;
    }
switchD_0055172c_caseD_16:
    pbVar13 = pbVar13 + (long)ppcStack_50;
  } while( true );
switchD_00551821_caseD_f:
  pbVar13 = pbVar11 + 1;
  if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
    return -1;
  }
  if (*pbVar13 == 0x3e) {
    *nextTokPtr = (char *)(pbVar11 + 2);
    return tok;
  }
LAB_005517f5:
  pbVar11 = pbVar13;
  uVar6 = (long)end - (long)pbVar11;
  if ((long)uVar6 < 1) {
    return -1;
  }
  bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
  if (0xf < (ulong)bVar2) {
switchD_00551821_caseD_2:
    pbVar13 = pbVar11 + 1;
    goto LAB_005517f5;
  }
  switch(bVar2) {
  case 0:
  case 1:
  case 8:
    break;
  default:
    goto switchD_00551821_caseD_2;
  case 5:
    if (uVar6 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar11);
    if (iVar4 == 0) {
      uVar12 = extraout_RDX_06;
      pbVar13 = pbVar11 + 2;
      goto LAB_005517f5;
    }
    break;
  case 6:
    if (uVar6 < 3) {
      return -2;
    }
    pcVar5 = (*enc[3].skipS)(enc,(char *)pbVar11);
    if ((int)pcVar5 == 0) {
      uVar12 = extraout_RDX_07;
      pbVar13 = pbVar11 + 3;
      goto LAB_005517f5;
    }
    break;
  case 7:
    if (uVar6 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar11,(int)uVar12,
                              (ATTRIBUTE *)
                              ((long)&switchD_00551821::switchdataD_00733000 +
                              (long)(int)(&switchD_00551821::switchdataD_00733000)[bVar2]));
    if (iVar4 == 0) {
      uVar12 = extraout_RDX_08;
      pbVar13 = pbVar11 + 4;
      goto LAB_005517f5;
    }
    break;
  case 0xf:
    goto switchD_00551821_caseD_f;
  }
  *nextTokPtr = (char *)pbVar11;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}